

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O2

void __thiscall OIDCallback::OIDCallback(OIDCallback *this,SortableOIDType *oid,string *value)

{
  (this->super_ValueCallback).OID = oid;
  (this->super_ValueCallback).type = OID;
  (this->super_ValueCallback).isSettable = false;
  (this->super_ValueCallback).setOccurred = false;
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_0019bb18;
  std::__cxx11::string::string((string *)&this->value,(string *)value);
  return;
}

Assistant:

OIDCallback(SortableOIDType* oid, const std::string &value): ValueCallback(oid, ASN_TYPE::OID), value(value) {}